

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VtabCallCreate(sqlite3 *db,int iDb,char *zTab,char **pzErr)

{
  Table *pTab_00;
  sqlite3 *db_00;
  char *pcVar1;
  VTable *pVVar2;
  undefined8 *in_RCX;
  sqlite3 *in_RDI;
  char *zMod;
  Module *pMod;
  Table *pTab;
  _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
  *in_stack_00000020;
  int rc;
  undefined4 in_stack_00000038;
  char *in_stack_ffffffffffffffb8;
  sqlite3 *db_01;
  uint in_stack_ffffffffffffffd8;
  int iVar3;
  
  pTab_00 = sqlite3FindTable((sqlite3 *)(ulong)in_stack_ffffffffffffffd8,&DAT_aaaaaaaaaaaaaaaa,
                             &DAT_aaaaaaaaaaaaaaaa);
  db_01 = (sqlite3 *)((pTab_00->u).tab.pFKey)->pFrom;
  db_00 = (sqlite3 *)sqlite3HashFind((Hash *)db_01,in_stack_ffffffffffffffb8);
  if (((db_00 == (sqlite3 *)0x0) || (*(long *)&db_00->pVfs->mxPathname == 0)) ||
     (db_00->pVfs->xOpen ==
      (_func_int_sqlite3_vfs_ptr_sqlite3_filename_sqlite3_file_ptr_int_int_ptr *)0x0)) {
    pcVar1 = sqlite3MPrintf(in_RDI,"no such module: %s",db_01);
    *in_RCX = pcVar1;
    iVar3 = 1;
  }
  else {
    iVar3 = vtabCallConstructor((sqlite3 *)CONCAT44(iDb,in_stack_00000038),(Table *)zTab,
                                (Module *)pzErr,in_stack_00000020,&pTab->zName);
  }
  if (((iVar3 == 0) && (pVVar2 = sqlite3GetVTable(in_RDI,pTab_00), pVVar2 != (VTable *)0x0)) &&
     (iVar3 = growVTrans(db_00), iVar3 == 0)) {
    sqlite3GetVTable(in_RDI,pTab_00);
    addToVTrans(db_01,(VTable *)in_RDI);
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabCallCreate(sqlite3 *db, int iDb, const char *zTab, char **pzErr){
  int rc = SQLITE_OK;
  Table *pTab;
  Module *pMod;
  const char *zMod;

  pTab = sqlite3FindTable(db, zTab, db->aDb[iDb].zDbSName);
  assert( pTab && IsVirtual(pTab) && !pTab->u.vtab.p );

  /* Locate the required virtual table module */
  zMod = pTab->u.vtab.azArg[0];
  pMod = (Module*)sqlite3HashFind(&db->aModule, zMod);

  /* If the module has been registered and includes a Create method,
  ** invoke it now. If the module has not been registered, return an
  ** error. Otherwise, do nothing.
  */
  if( pMod==0 || pMod->pModule->xCreate==0 || pMod->pModule->xDestroy==0 ){
    *pzErr = sqlite3MPrintf(db, "no such module: %s", zMod);
    rc = SQLITE_ERROR;
  }else{
    rc = vtabCallConstructor(db, pTab, pMod, pMod->pModule->xCreate, pzErr);
  }

  /* Justification of ALWAYS():  The xConstructor method is required to
  ** create a valid sqlite3_vtab if it returns SQLITE_OK. */
  if( rc==SQLITE_OK && ALWAYS(sqlite3GetVTable(db, pTab)) ){
    rc = growVTrans(db);
    if( rc==SQLITE_OK ){
      addToVTrans(db, sqlite3GetVTable(db, pTab));
    }
  }

  return rc;
}